

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stcp.c
# Opt level: O0

void nn_stcp_handler(nn_fsm *self,int src,int type,void *srcptr)

{
  int iVar1;
  uint64_t uVar2;
  void *optval;
  nn_usock *self_00;
  uint in_EDX;
  uint in_ESI;
  long in_RDI;
  size_t opt_sz;
  int opt;
  uint64_t size;
  nn_stcp *stcp;
  int rc;
  nn_pipebase *in_stack_ffffffffffffff78;
  undefined4 in_stack_ffffffffffffff80;
  undefined4 in_stack_ffffffffffffff84;
  nn_usock *in_stack_ffffffffffffff88;
  nn_streamhdr *in_stack_ffffffffffffff90;
  size_t len;
  undefined4 in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffff9c;
  nn_usock *in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffac;
  long lVar3;
  nn_pipebase *self_01;
  uint local_34;
  
  self_01 = (nn_pipebase *)0x4;
  if (in_RDI == 0) {
    in_RDI = 0;
  }
  optval = (void *)(ulong)(*(int *)(in_RDI + 0x58) - 1);
  switch(optval) {
  case (void *)0x0:
    if (in_ESI != 0xfffffffe) {
      nn_backtrace_print();
      fprintf(_stderr,"%s: state=%d source=%d action=%d (%s:%d)\n","Unexpected source",
              (ulong)*(uint *)(in_RDI + 0x58),(ulong)in_ESI,(ulong)in_EDX,
              "/workspace/llm4binary/github/license_all_cmakelists_25/nqbit[P]goestools/vendor/nanomsg/src/transports/tcp/stcp.c"
              ,0xe8);
      fflush(_stderr);
      nn_err_abort();
    }
    if (in_EDX != 0xfffffffe) {
      nn_backtrace_print();
      fprintf(_stderr,"%s: state=%d source=%d action=%d (%s:%d)\n","Unexpected action",
              (ulong)*(uint *)(in_RDI + 0x58),0xfffffffe,(ulong)in_EDX,
              "/workspace/llm4binary/github/license_all_cmakelists_25/nqbit[P]goestools/vendor/nanomsg/src/transports/tcp/stcp.c"
              ,0xe4);
      fflush(_stderr);
      nn_err_abort();
    }
    nn_streamhdr_start(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,
                       (nn_pipebase *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80))
    ;
    *(undefined4 *)(in_RDI + 0x58) = 2;
    break;
  case (void *)0x1:
    if (in_ESI != 2) {
      nn_backtrace_print();
      fprintf(_stderr,"%s: state=%d source=%d action=%d (%s:%d)\n","Unexpected source",
              (ulong)*(uint *)(in_RDI + 0x58),(ulong)in_ESI,(ulong)in_EDX,
              "/workspace/llm4binary/github/license_all_cmakelists_25/nqbit[P]goestools/vendor/nanomsg/src/transports/tcp/stcp.c"
              ,0x108);
      fflush(_stderr);
      nn_err_abort();
    }
    if (in_EDX == 1) {
      nn_streamhdr_stop((nn_streamhdr *)0x1ee094);
      *(undefined4 *)(in_RDI + 0x58) = 3;
    }
    else {
      if (in_EDX != 2) {
        nn_backtrace_print();
        fprintf(_stderr,"%s: state=%d source=%d action=%d (%s:%d)\n","Unexpected action",
                (ulong)*(uint *)(in_RDI + 0x58),2,(ulong)in_EDX,
                "/workspace/llm4binary/github/license_all_cmakelists_25/nqbit[P]goestools/vendor/nanomsg/src/transports/tcp/stcp.c"
                ,0x104);
        fflush(_stderr);
        nn_err_abort();
      }
      *(undefined4 *)(in_RDI + 0x58) = 6;
      nn_fsm_raise((nn_fsm *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                   (nn_fsm_event *)in_stack_ffffffffffffff78,0);
    }
    break;
  case (void *)0x2:
    if (in_ESI != 2) {
      nn_backtrace_print();
      fprintf(_stderr,"%s: state=%d source=%d action=%d (%s:%d)\n","Unexpected source",
              (ulong)*(uint *)(in_RDI + 0x58),(ulong)in_ESI,(ulong)in_EDX,
              "/workspace/llm4binary/github/license_all_cmakelists_25/nqbit[P]goestools/vendor/nanomsg/src/transports/tcp/stcp.c"
              ,0x12d);
      fflush(_stderr);
      nn_err_abort();
    }
    if (in_EDX != 3) {
      nn_backtrace_print();
      fprintf(_stderr,"%s: state=%d source=%d action=%d (%s:%d)\n","Unexpected action",
              (ulong)*(uint *)(in_RDI + 0x58),2,(ulong)in_EDX,
              "/workspace/llm4binary/github/license_all_cmakelists_25/nqbit[P]goestools/vendor/nanomsg/src/transports/tcp/stcp.c"
              ,0x129);
      fflush(_stderr);
      nn_err_abort();
    }
    iVar1 = nn_pipebase_start(in_stack_ffffffffffffff78);
    if (iVar1 < 0) {
      *(undefined4 *)(in_RDI + 0x58) = 6;
      nn_fsm_raise((nn_fsm *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                   (nn_fsm_event *)in_stack_ffffffffffffff78,0);
    }
    else {
      *(undefined4 *)(in_RDI + 0x2e8) = 1;
      nn_usock_recv(in_stack_ffffffffffffffa0,
                    (void *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),
                    (size_t)in_stack_ffffffffffffff90,(int *)in_stack_ffffffffffffff88);
      *(undefined4 *)(in_RDI + 0x358) = 1;
      *(undefined4 *)(in_RDI + 0x58) = 4;
    }
    break;
  case (void *)0x3:
    if (in_ESI != 1) {
      nn_backtrace_print();
      fprintf(_stderr,"%s: state=%d source=%d action=%d (%s:%d)\n","Unexpected source",
              (ulong)*(uint *)(in_RDI + 0x58),(ulong)in_ESI,(ulong)in_EDX,
              "/workspace/llm4binary/github/license_all_cmakelists_25/nqbit[P]goestools/vendor/nanomsg/src/transports/tcp/stcp.c"
              ,0x186);
      fflush(_stderr);
      nn_err_abort();
    }
    self_00 = (nn_usock *)(ulong)(in_EDX - 3);
    switch(self_00) {
    case (nn_usock *)0x0:
      if (*(int *)(in_RDI + 0x358) != 2) {
        nn_backtrace_print();
        fprintf(_stderr,"Assertion failed: %s (%s:%d)\n",
                "stcp->outstate == NN_STCP_OUTSTATE_SENDING",
                "/workspace/llm4binary/github/license_all_cmakelists_25/nqbit[P]goestools/vendor/nanomsg/src/transports/tcp/stcp.c"
                ,0x13b);
        fflush(_stderr);
        nn_err_abort();
      }
      *(undefined4 *)(in_RDI + 0x358) = 1;
      nn_msg_term((nn_msg *)0x1ee3d5);
      nn_msg_init((nn_msg *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                  (size_t)in_stack_ffffffffffffff78);
      nn_pipebase_sent((nn_pipebase *)0x1ee3fb);
      break;
    case (nn_usock *)0x1:
      iVar1 = *(int *)(in_RDI + 0x2e8);
      if (iVar1 == 1) {
        lVar3 = in_RDI;
        uVar2 = nn_getll((uint8_t *)(in_RDI + 0x2ec));
        nn_pipebase_getopt(self_01,(int)((ulong)lVar3 >> 0x20),(int)lVar3,optval,
                           (size_t *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
        if (((int)local_34 < 0) || (uVar2 <= local_34)) {
          nn_msg_term((nn_msg *)0x1ee4b2);
          nn_msg_init((nn_msg *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                      (size_t)in_stack_ffffffffffffff78);
          if (uVar2 == 0) {
            *(undefined4 *)(in_RDI + 0x2e8) = 3;
            nn_pipebase_received((nn_pipebase *)0x1ee4f0);
          }
          else {
            *(undefined4 *)(in_RDI + 0x2e8) = 2;
            len = *(size_t *)(in_RDI + 0x60);
            nn_chunkref_data((nn_chunkref *)(in_RDI + 0x338));
            nn_usock_recv(self_00,(void *)CONCAT44(iVar1,in_stack_ffffffffffffff98),len,
                          (int *)in_stack_ffffffffffffff88);
          }
        }
        else {
          *(undefined4 *)(in_RDI + 0x58) = 6;
          nn_fsm_raise((nn_fsm *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                       (nn_fsm_event *)in_stack_ffffffffffffff78,0);
        }
      }
      else {
        if (iVar1 != 2) {
          nn_backtrace_print();
          fprintf(_stderr,"%s: state=%d source=%d action=%d (%s:%d)\n","Unexpected socket instate",
                  (ulong)*(uint *)(in_RDI + 0x58),1,(ulong)in_EDX,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/nqbit[P]goestools/vendor/nanomsg/src/transports/tcp/stcp.c"
                  ,0x173);
          fflush(_stderr);
          nn_err_abort();
        }
        *(undefined4 *)(in_RDI + 0x2e8) = 3;
        nn_pipebase_received((nn_pipebase *)0x1ee562);
      }
      break;
    case (nn_usock *)0x2:
      nn_pipebase_stop((nn_pipebase *)0x1ee5f9);
      *(undefined4 *)(in_RDI + 0x58) = 6;
      nn_fsm_raise((nn_fsm *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                   (nn_fsm_event *)in_stack_ffffffffffffff78,0);
      break;
    default:
      nn_backtrace_print();
      fprintf(_stderr,"%s: state=%d source=%d action=%d (%s:%d)\n","Unexpected action",
              (ulong)*(uint *)(in_RDI + 0x58),1,(ulong)in_EDX,
              "/workspace/llm4binary/github/license_all_cmakelists_25/nqbit[P]goestools/vendor/nanomsg/src/transports/tcp/stcp.c"
              ,0x182);
      fflush(_stderr);
      nn_err_abort();
    case (nn_usock *)0x5:
      nn_pipebase_stop((nn_pipebase *)0x1ee5d7);
      *(undefined4 *)(in_RDI + 0x58) = 5;
    }
    break;
  case (void *)0x4:
    if (in_ESI != 1) {
      nn_backtrace_print();
      fprintf(_stderr,"%s: state=%d source=%d action=%d (%s:%d)\n","Unexpected source",
              (ulong)*(uint *)(in_RDI + 0x58),(ulong)in_ESI,(ulong)in_EDX,
              "/workspace/llm4binary/github/license_all_cmakelists_25/nqbit[P]goestools/vendor/nanomsg/src/transports/tcp/stcp.c"
              ,0x19c);
      fflush(_stderr);
      nn_err_abort();
    }
    if (in_EDX != 5) {
      nn_backtrace_print();
      fprintf(_stderr,"%s: state=%d source=%d action=%d (%s:%d)\n","Unexpected action",
              (ulong)*(uint *)(in_RDI + 0x58),1,(ulong)in_EDX,
              "/workspace/llm4binary/github/license_all_cmakelists_25/nqbit[P]goestools/vendor/nanomsg/src/transports/tcp/stcp.c"
              ,0x198);
      fflush(_stderr);
      nn_err_abort();
    }
    *(undefined4 *)(in_RDI + 0x58) = 6;
    nn_fsm_raise((nn_fsm *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                 (nn_fsm_event *)in_stack_ffffffffffffff78,0);
    break;
  case (void *)0x5:
    nn_backtrace_print();
    fprintf(_stderr,"%s: state=%d source=%d action=%d (%s:%d)\n","Unexpected source",
            (ulong)*(uint *)(in_RDI + 0x58),(ulong)in_ESI,(ulong)in_EDX,
            "/workspace/llm4binary/github/license_all_cmakelists_25/nqbit[P]goestools/vendor/nanomsg/src/transports/tcp/stcp.c"
            ,0x1a6);
    fflush(_stderr);
    nn_err_abort();
  default:
    nn_backtrace_print();
    fprintf(_stderr,"%s: state=%d source=%d action=%d (%s:%d)\n","Unexpected state",
            (ulong)*(uint *)(in_RDI + 0x58),(ulong)in_ESI,(ulong)in_EDX,
            "/workspace/llm4binary/github/license_all_cmakelists_25/nqbit[P]goestools/vendor/nanomsg/src/transports/tcp/stcp.c"
            ,0x1ac);
    fflush(_stderr);
    nn_err_abort();
  }
  return;
}

Assistant:

static void nn_stcp_handler (struct nn_fsm *self, int src, int type,
    NN_UNUSED void *srcptr)
{
    int rc;
    struct nn_stcp *stcp;
    uint64_t size;
    int opt;
    size_t opt_sz = sizeof (opt);

    stcp = nn_cont (self, struct nn_stcp, fsm);

    switch (stcp->state) {

/******************************************************************************/
/*  IDLE state.                                                               */
/******************************************************************************/
    case NN_STCP_STATE_IDLE:
        switch (src) {

        case NN_FSM_ACTION:
            switch (type) {
            case NN_FSM_START:
                nn_streamhdr_start (&stcp->streamhdr, stcp->usock,
                    &stcp->pipebase);
                stcp->state = NN_STCP_STATE_PROTOHDR;
                return;
            default:
                nn_fsm_bad_action (stcp->state, src, type);
            }

        default:
            nn_fsm_bad_source (stcp->state, src, type);
        }

/******************************************************************************/
/*  PROTOHDR state.                                                           */
/******************************************************************************/
    case NN_STCP_STATE_PROTOHDR:
        switch (src) {

        case NN_STCP_SRC_STREAMHDR:
            switch (type) {
            case NN_STREAMHDR_OK:

                /*  Before moving to the active state stop the streamhdr
                    state machine. */
                nn_streamhdr_stop (&stcp->streamhdr);
                stcp->state = NN_STCP_STATE_STOPPING_STREAMHDR;
                return;

            case NN_STREAMHDR_ERROR:

                /* Raise the error and move directly to the DONE state.
                   streamhdr object will be stopped later on. */
                stcp->state = NN_STCP_STATE_DONE;
                nn_fsm_raise (&stcp->fsm, &stcp->done, NN_STCP_ERROR);
                return;

            default:
                nn_fsm_bad_action (stcp->state, src, type);
            }

        default:
            nn_fsm_bad_source (stcp->state, src, type);
        }

/******************************************************************************/
/*  STOPPING_STREAMHDR state.                                                 */
/******************************************************************************/
    case NN_STCP_STATE_STOPPING_STREAMHDR:
        switch (src) {

        case NN_STCP_SRC_STREAMHDR:
            switch (type) {
            case NN_STREAMHDR_STOPPED:

                 /*  Start the pipe. */
                 rc = nn_pipebase_start (&stcp->pipebase);
                 if (nn_slow (rc < 0)) {
                    stcp->state = NN_STCP_STATE_DONE;
                    nn_fsm_raise (&stcp->fsm, &stcp->done, NN_STCP_ERROR);
                    return;
                 }

                 /*  Start receiving a message in asynchronous manner. */
                 stcp->instate = NN_STCP_INSTATE_HDR;
                 nn_usock_recv (stcp->usock, &stcp->inhdr,
                     sizeof (stcp->inhdr), NULL);

                 /*  Mark the pipe as available for sending. */
                 stcp->outstate = NN_STCP_OUTSTATE_IDLE;

                 stcp->state = NN_STCP_STATE_ACTIVE;
                 return;

            default:
                nn_fsm_bad_action (stcp->state, src, type);
            }

        default:
            nn_fsm_bad_source (stcp->state, src, type);
        }

/******************************************************************************/
/*  ACTIVE state.                                                             */
/******************************************************************************/
    case NN_STCP_STATE_ACTIVE:
        switch (src) {

        case NN_STCP_SRC_USOCK:
            switch (type) {
            case NN_USOCK_SENT:

                /*  The message is now fully sent. */
                nn_assert (stcp->outstate == NN_STCP_OUTSTATE_SENDING);
                stcp->outstate = NN_STCP_OUTSTATE_IDLE;
                nn_msg_term (&stcp->outmsg);
                nn_msg_init (&stcp->outmsg, 0);
                nn_pipebase_sent (&stcp->pipebase);
                return;

            case NN_USOCK_RECEIVED:

                switch (stcp->instate) {
                case NN_STCP_INSTATE_HDR:

                    /*  Message header was received. Check that message size
                        is acceptable by comparing with NN_RCVMAXSIZE;
                        if it's too large, drop the connection. */
                    size = nn_getll (stcp->inhdr);

                    nn_pipebase_getopt (&stcp->pipebase, NN_SOL_SOCKET,
                        NN_RCVMAXSIZE, &opt, &opt_sz);

                    if (opt >= 0 && size > (unsigned)opt) {
                        stcp->state = NN_STCP_STATE_DONE;
                        nn_fsm_raise (&stcp->fsm, &stcp->done, NN_STCP_ERROR);
                        return;
                    }

                    /*  Allocate memory for the message. */
                    nn_msg_term (&stcp->inmsg);
                    nn_msg_init (&stcp->inmsg, (size_t) size);

                    /*  Special case when size of the message body is 0. */
                    if (!size) {
                        stcp->instate = NN_STCP_INSTATE_HASMSG;
                        nn_pipebase_received (&stcp->pipebase);
                        return;
                    }

                    /*  Start receiving the message body. */
                    stcp->instate = NN_STCP_INSTATE_BODY;
                    nn_usock_recv (stcp->usock,
                        nn_chunkref_data (&stcp->inmsg.body),
                       (size_t) size, NULL);

                    return;

                case NN_STCP_INSTATE_BODY:

                    /*  Message body was received. Notify the owner that it
                        can receive it. */
                    stcp->instate = NN_STCP_INSTATE_HASMSG;
                    nn_pipebase_received (&stcp->pipebase);

                    return;

                default:
                    nn_fsm_error("Unexpected socket instate",
                        stcp->state, src, type);
                }

            case NN_USOCK_SHUTDOWN:
                nn_pipebase_stop (&stcp->pipebase);
                stcp->state = NN_STCP_STATE_SHUTTING_DOWN;
                return;

            case NN_USOCK_ERROR:
                nn_pipebase_stop (&stcp->pipebase);
                stcp->state = NN_STCP_STATE_DONE;
                nn_fsm_raise (&stcp->fsm, &stcp->done, NN_STCP_ERROR);
                return;

            default:
                nn_fsm_bad_action (stcp->state, src, type);
            }

        default:
            nn_fsm_bad_source (stcp->state, src, type);
        }

/******************************************************************************/
/*  SHUTTING_DOWN state.                                                      */
/*  The underlying connection is closed. We are just waiting that underlying  */
/*  usock being closed                                                        */
/******************************************************************************/
    case NN_STCP_STATE_SHUTTING_DOWN:
        switch (src) {

        case NN_STCP_SRC_USOCK:
            switch (type) {
            case NN_USOCK_ERROR:
                stcp->state = NN_STCP_STATE_DONE;
                nn_fsm_raise (&stcp->fsm, &stcp->done, NN_STCP_ERROR);
                return;
            default:
                nn_fsm_bad_action (stcp->state, src, type);
            }

        default:
            nn_fsm_bad_source (stcp->state, src, type);
        }


/******************************************************************************/
/*  DONE state.                                                               */
/*  The underlying connection is closed. There's nothing that can be done in  */
/*  this state except stopping the object.                                    */
/******************************************************************************/
    case NN_STCP_STATE_DONE:
        nn_fsm_bad_source (stcp->state, src, type);

/******************************************************************************/
/*  Invalid state.                                                            */
/******************************************************************************/
    default:
        nn_fsm_bad_state (stcp->state, src, type);
    }
}